

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.h
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
Tools::ReadAllFilesInDir_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Tools *this)

{
  long *plVar1;
  directory_iterator __begin1;
  allocator<char> local_b1;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_b0;
  string_type local_a8;
  directory_iterator local_88;
  path local_78;
  string local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,(this->path->_M_dataplus)._M_p,&local_b1);
  std::filesystem::__cxx11::path::path(&local_78,&local_a8,auto_format);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            (&local_88,&local_78,none,(error_code *)0x0);
  std::filesystem::__cxx11::path::~path(&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (local_88._M_dir._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_a8._M_dataplus._M_p = (pointer)local_88._M_dir._M_ptr;
    local_a8._M_string_length = 0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_88._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_88._M_dir._M_refcount._M_pi + 8) + 1;
      UNLOCK();
      local_a8._M_dataplus._M_p = (pointer)local_88._M_dir._M_ptr;
      local_a8._M_string_length = (size_type)local_88._M_dir._M_refcount._M_pi;
      if (local_88._M_dir._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
      goto LAB_00106863;
    }
    else {
      *(int *)(local_88._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_88._M_dir._M_refcount._M_pi + 8) + 1;
    }
    local_a8._M_dataplus._M_p = (pointer)local_88._M_dir._M_ptr;
    local_a8._M_string_length = (size_type)local_88._M_dir._M_refcount._M_pi;
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_88._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_88._M_dir._M_refcount._M_pi + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_88._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_88._M_dir._M_refcount._M_pi + 8) + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_dir._M_refcount._M_pi)
    ;
  }
LAB_00106863:
  while ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_string_length !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    plVar1 = (long *)std::filesystem::__cxx11::directory_iterator::operator*
                               ((directory_iterator *)&local_a8);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_50,*plVar1,plVar1[1] + *plVar1);
    CutPathString(&local_78._M_pathname,this,&local_50);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_b0,&local_78._M_pathname);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_pathname._M_dataplus._M_p != &local_78._M_pathname.field_2) {
      operator_delete(local_78._M_pathname._M_dataplus._M_p,
                      local_78._M_pathname.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    std::filesystem::__cxx11::directory_iterator::operator++((directory_iterator *)&local_a8);
  }
  if (local_88._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_dir._M_refcount._M_pi)
    ;
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_b0;
}

Assistant:

vector<string> ReadAllFilesInDir() {
        vector<string> filess;
        for (const auto &entry : fs::directory_iterator(string(this->path->data()))) {
            filess.push_back(this->CutPathString(entry.path()));
        }
        return filess;
    }